

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::CancelSpell(Character *this)

{
  TimeEvent *this_00;
  
  this->spell_target = TargetInvalid;
  this_00 = this->spell_event;
  if (this_00 != (TimeEvent *)0x0) {
    TimeEvent::~TimeEvent(this_00);
  }
  operator_delete(this_00,0x30);
  this->spell_event = (TimeEvent *)0x0;
  if (this->spell_ready == true) {
    this->spell_ready = false;
  }
  return;
}

Assistant:

void Character::CancelSpell()
{
	this->spell_target = TargetInvalid;

	delete this->spell_event;
	this->spell_event = 0;

	if (this->spell_ready)
	{
		this->spell_ready = false;
	}
}